

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::Compiler::getAllSourceInfo
          (Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Orphanage orphanage)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,0);
  Impl::getAllSourceInfo(__return_storage_ptr__,(this->impl).value.ptr,orphanage);
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Node::SourceInfo>> Compiler::getAllSourceInfo(Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getAllSourceInfo(orphanage);
}